

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall
string_to_uint_check_Test::~string_to_uint_check_Test(string_to_uint_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, to_uint_check)
{
    ST::conversion_result result;
    (void) ST_LITERAL("0").to_uint(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("100").to_uint(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("0x1FF").to_uint(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("1FF").to_uint(result, 16);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());
    (void) ST_LITERAL("0100").to_uint(result);
    EXPECT_TRUE(result.ok());
    EXPECT_TRUE(result.full_match());

    (void) ST_LITERAL("1FF").to_uint(result);
    EXPECT_TRUE(result.ok());
    EXPECT_FALSE(result.full_match());
    (void) ST_LITERAL("FF").to_uint(result);
    EXPECT_FALSE(result.ok());
    EXPECT_FALSE(result.full_match());
    (void) ST::string().to_uint(result);
    EXPECT_FALSE(result.ok());
    EXPECT_TRUE(result.full_match());
}